

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

void * slider_new(t_symbol *s,int argc,t_atom *argv)

{
  t_iem_orientation tVar1;
  t_iem_fstyle_flags tVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  t_slider *x;
  _glist *p_Var6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  t_float tVar12;
  t_float tVar13;
  int local_88;
  int local_84;
  int local_80;
  double local_78;
  double local_70;
  t_iemgui_drawfunctions local_68;
  
  x = (t_slider *)iemgui_new(slider_class);
  iVar9 = (x->x_gui).x_fontsize;
  local_68.draw_new = slider_draw_new;
  local_68.draw_config = slider_draw_config;
  local_68.draw_iolets = slider_draw_io;
  local_68.draw_update = slider_draw_update;
  local_68.draw_select = slider_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x,&local_68);
  if (*s->s_name == 'v') {
    x->x_orientation = vertical;
  }
  tVar1 = x->x_orientation;
  p_Var6 = canvas_getcurrent();
  local_80 = 0;
  iVar3 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  p_Var6 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var6->gl_font,1,0);
  local_88 = (int)(((double)(iVar4 + 5) / 15.0) * 128.0);
  if (tVar1 == horizontal) {
    p_Var6 = canvas_getcurrent();
    iVar4 = sys_zoomfontheight(p_Var6->gl_font,1,0);
    local_84 = (int)((double)(iVar4 * -8 + -0x28) / 15.0);
    local_80 = -2;
    iVar4 = iVar3 + 5;
  }
  else {
    local_84 = -9;
    iVar4 = local_88;
    local_88 = iVar3 + 5;
  }
  if (((((((argc - 0x11U < 2) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
        ((argv[2].a_type == A_FLOAT && (argv[3].a_type == A_FLOAT)))) &&
       ((argv[4].a_type == A_FLOAT &&
        ((argv[5].a_type == A_FLOAT && (argv[6].a_type - A_FLOAT < 2)))))) &&
      (argv[7].a_type - A_FLOAT < 2)) &&
     ((((argv[8].a_type - A_FLOAT < 2 && (argv[9].a_type == A_FLOAT)) &&
       (argv[10].a_type == A_FLOAT)) &&
      (((argv[0xb].a_type == A_FLOAT && (argv[0xc].a_type == A_FLOAT)) &&
       (argv[0x10].a_type == A_FLOAT)))))) {
    tVar12 = atom_getfloatarg(0,argc,argv);
    local_88 = (int)tVar12;
    tVar12 = atom_getfloatarg(1,argc,argv);
    iVar4 = (int)tVar12;
    tVar12 = atom_getfloatarg(2,argc,argv);
    local_70 = (double)tVar12;
    tVar12 = atom_getfloatarg(3,argc,argv);
    local_78 = (double)tVar12;
    tVar12 = atom_getfloatarg(4,argc,argv);
    tVar13 = atom_getfloatarg(5,argc,argv);
    iem_inttosymargs(&(x->x_gui).x_isa,(int)tVar13);
    iemgui_new_getnames((t_iemgui *)x,6,argv);
    tVar13 = atom_getfloatarg(9,argc,argv);
    local_80 = (int)tVar13;
    tVar13 = atom_getfloatarg(10,argc,argv);
    local_84 = (int)tVar13;
    tVar13 = atom_getfloatarg(0xb,argc,argv);
    iem_inttofstyle(&(x->x_gui).x_fsf,(int)tVar13);
    tVar13 = atom_getfloatarg(0xc,argc,argv);
    iVar9 = (int)tVar13;
    iemgui_all_loadcolors((t_iemgui *)x,argv + 0xd,argv + 0xe,argv + 0xf);
    tVar13 = atom_getfloatarg(0x10,argc,argv);
    uVar11 = (uint)tVar13;
    uVar10 = (uint)((int)tVar12 != 0);
  }
  else {
    uVar10 = 0;
    iemgui_new_getnames((t_iemgui *)x,6,(t_atom *)0x0);
    local_78 = 127.0;
    local_70 = 0.0;
    uVar11 = 0;
  }
  uVar5 = 1;
  if ((argc == 0x12) && (argv[0x11].a_type == A_FLOAT)) {
    tVar12 = atom_getfloatarg(0x11,0x12,argv);
    uVar5 = (uint)((int)tVar12 != 0);
  }
  uVar7 = (uint)((x->x_gui).x_snd != (t_symbol *)0x0) << 7;
  tVar2 = (x->x_gui).x_fsf;
  uVar8 = (uint)((x->x_gui).x_rcv != (t_symbol *)0x0) << 6;
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)(uVar8 | (uint)tVar2 & 0xffffff3f | uVar7);
  x->x_val = -((uint)(x->x_gui).x_isa & 1) & uVar11;
  x->x_lin0_log1 = uVar10;
  x->x_steady = uVar5;
  if (((uint)tVar2 & 0x3f) == 2) {
    builtin_strncpy((x->x_gui).x_font,"times",6);
  }
  else if (((uint)tVar2 & 0x3f) == 1) {
    builtin_strncpy((x->x_gui).x_font,"helvetica",10);
  }
  else {
    (x->x_gui).x_fsf = (t_iem_fstyle_flags)(uVar8 | (uint)tVar2 & 0xffffff00 | uVar7);
    strcpy((x->x_gui).x_font,sys_font);
  }
  if (((uint)(x->x_gui).x_fsf & 0x40) != 0) {
    pd_bind((t_pd *)x,(x->x_gui).x_rcv);
  }
  (x->x_gui).x_ldx = local_80;
  iVar3 = 4;
  if (4 < iVar9) {
    iVar3 = iVar9;
  }
  (x->x_gui).x_ldy = local_84;
  (x->x_gui).x_fontsize = iVar3;
  if (x->x_orientation == horizontal) {
    iVar9 = slider_check_range(x,local_88);
    (x->x_gui).x_w = iVar9;
    iVar9 = iemgui_clip_size(iVar4);
  }
  else {
    iVar9 = iemgui_clip_size(local_88);
    (x->x_gui).x_w = iVar9;
    iVar9 = slider_check_range(x,iVar4);
  }
  (x->x_gui).x_h = iVar9;
  iemgui_verify_snd_ne_rcv((t_iemgui *)x);
  iemgui_newzoom((t_iemgui *)x);
  slider_check_minmax(x,local_70,local_78,
                      (float)*(int *)((x->x_gui).x_font +
                                     (ulong)(x->x_orientation == horizontal) * 4 + -0x18));
  outlet_new((t_object *)x,&s_float);
  tVar12 = slider_getfval(x);
  x->x_fval = tVar12;
  return x;
}

Assistant:

static void *slider_new(t_symbol *s, int argc, t_atom *argv)
{
    t_slider *x = (t_slider *)iemgui_new(slider_class);
    int lilo = 0, steady = 1;
    int fs = x->x_gui.x_fontsize;
    double min = 0.0, max = (double)(IEM_SL_DEFAULTSIZE-1);
    t_float v = 0;
    int w, h, ldx, ldy;

    IEMGUI_SETDRAWFUNCTIONS(x, slider);

    if('v' == *s->s_name)
        x->x_orientation = vertical;

    if(x->x_orientation == horizontal)
    {
        w = IEM_SL_DEFAULTSIZE;
        h = IEM_GUI_DEFAULTSIZE;
        w *= IEM_GUI_DEFAULTSIZE_SCALE; /* keep aspect ratio */

        ldx = -2;
        ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    } else {
        w = IEM_GUI_DEFAULTSIZE;
        h = IEM_SL_DEFAULTSIZE;
        h *= IEM_GUI_DEFAULTSIZE_SCALE; /* keep aspect ratio */

        ldx = 0;
        ldy = -9;
    }

    if(((argc == 17)||(argc == 18))&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&IS_A_FLOAT(argv,2)&&IS_A_FLOAT(argv,3)
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&(IS_A_SYMBOL(argv,7)||IS_A_FLOAT(argv,7))
       &&(IS_A_SYMBOL(argv,8)||IS_A_FLOAT(argv,8))
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)
       &&IS_A_FLOAT(argv,11)&&IS_A_FLOAT(argv,12)&&IS_A_FLOAT(argv,16))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        min = (double)atom_getfloatarg(2, argc, argv);
        max = (double)atom_getfloatarg(3, argc, argv);
        lilo = (int)atom_getfloatarg(4, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(5, argc, argv));
        iemgui_new_getnames(&x->x_gui, 6, argv);
        ldx = (int)atom_getfloatarg(9, argc, argv);
        ldy = (int)atom_getfloatarg(10, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(11, argc, argv));
        fs = (int)atom_getfloatarg(12, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+13, argv+14, argv+15);
        v = atom_getfloatarg(16, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 6, 0);
    if((argc == 18)&&IS_A_FLOAT(argv,17))
        steady = (int)atom_getfloatarg(17, argc, argv);
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if (x->x_gui.x_isa.x_loadinit)
        x->x_val = v;
    else x->x_val = 0;
    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    if(steady != 0) steady = 1;
    x->x_steady = steady;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able) pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;

    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_w = slider_check_range(x, w);
        x->x_gui.x_h = iemgui_clip_size(h);
    } else {
        x->x_gui.x_w = iemgui_clip_size(w);
        x->x_gui.x_h = slider_check_range(x, h);
    }

    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    slider_check_minmax(x, min, max,
        (x->x_orientation==horizontal)?x->x_gui.x_w:x->x_gui.x_h);

    outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_fval = slider_getfval(x);
    return (x);
}